

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall
LatencyCollector::addLatency(LatencyCollector *this,string *lat_name,uint64_t lat_value)

{
  LatencyItem *this_00;
  ashared_ptr<MapWrapper> *in_RDI;
  bool bVar1;
  MapWrapperSP expected;
  MapWrapperSP new_map;
  MapWrapper *new_map_raw;
  LatencyItem *item;
  size_t ticks_allowed;
  MapWrapperSP cur_map;
  undefined7 in_stack_fffffffffffffea8;
  byte in_stack_fffffffffffffeaf;
  LatencyItem *in_stack_fffffffffffffeb0;
  ashared_ptr<MapWrapper> *in_stack_fffffffffffffec8;
  MapWrapper *in_stack_fffffffffffffed0;
  MapWrapper *in_stack_fffffffffffffed8;
  ashared_ptr<MapWrapper> *src;
  ashared_ptr<MapWrapper> *in_stack_fffffffffffffee0;
  ashared_ptr<MapWrapper> *in_stack_fffffffffffffee8;
  string *in_stack_ffffffffffffff18;
  MapWrapper *in_stack_ffffffffffffff20;
  long local_50;
  
  ashared_ptr<MapWrapper>::ashared_ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_50 = 0x10;
  while( true ) {
    ashared_ptr<MapWrapper>::operator=(in_RDI,in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 =
         (ashared_ptr<MapWrapper> *)
         ashared_ptr<MapWrapper>::operator->((ashared_ptr<MapWrapper> *)0x1055ce);
    this_00 = MapWrapper::get(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    if (this_00 != (LatencyItem *)0x0) break;
    in_stack_fffffffffffffec8 = (ashared_ptr<MapWrapper> *)operator_new(0x38);
    MapWrapper::MapWrapper((MapWrapper *)0x105661);
    src = in_stack_fffffffffffffec8;
    in_stack_fffffffffffffed0 =
         ashared_ptr<MapWrapper>::operator*((ashared_ptr<MapWrapper> *)0x10568a);
    MapWrapper::copyFrom
              ((MapWrapper *)in_stack_fffffffffffffeb0,
               (MapWrapper *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    ashared_ptr<MapWrapper>::ashared_ptr((ashared_ptr<MapWrapper> *)this_00,(MapWrapper *)src);
    ashared_ptr<MapWrapper>::operator->((ashared_ptr<MapWrapper> *)0x1056c6);
    MapWrapper::addItem(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    LatencyItem::addLatency
              (in_stack_fffffffffffffeb0,
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    ashared_ptr<MapWrapper>::ashared_ptr
              ((ashared_ptr<MapWrapper> *)in_stack_fffffffffffffeb0,
               (ashared_ptr<MapWrapper> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffeb0 =
         (LatencyItem *)&(in_RDI->lock).super___mutex_base._M_mutex.__data.__list.__next;
    ashared_ptr<MapWrapper>::ashared_ptr
              ((ashared_ptr<MapWrapper> *)in_stack_fffffffffffffeb0,
               (ashared_ptr<MapWrapper> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffeaf =
         ashared_ptr<MapWrapper>::compare_exchange
                   (in_stack_fffffffffffffee8,(ashared_ptr<MapWrapper> *)this_00,src);
    ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x10576a);
    bVar1 = (in_stack_fffffffffffffeaf & 1) != 0;
    if (!bVar1) {
      MapWrapper::delItem((MapWrapper *)this_00,(string *)src);
    }
    ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x10582e);
    ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x10583b);
    if ((bVar1) || (bVar1 = local_50 == 0, local_50 = local_50 + -1, bVar1)) goto LAB_00105876;
  }
  LatencyItem::addLatency
            (in_stack_fffffffffffffeb0,CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)
            );
LAB_00105876:
  ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x105883);
  return;
}

Assistant:

void addLatency(const std::string& lat_name, uint64_t lat_value) {
        MapWrapperSP cur_map = nullptr;

        size_t ticks_allowed = MAX_ADD_NEW_ITEM_RETRIES;
        do {
            cur_map = latestMap;
            LatencyItem *item = cur_map->get(lat_name);
            if (item) {
                // Found existing latency.
                item->addLatency(lat_value);
                return;
            }

            // Not found,
            // 1) Create a new map containing new stat in an MVCC manner, and
            // 2) Replace 'latestMap' pointer atomically.

            // Note:
            // Below insertion process happens only when a new stat item
            // is added. Generally the number of stats is not pretty big (<100),
            // and adding new stats will be finished at the very early stage.
            // Once all stats are populated in the map, below codes will never
            // be called, and adding new latency will be done without blocking
            // anything.

            // Copy from the current map.
            MapWrapper* new_map_raw = new MapWrapper();
            new_map_raw->copyFrom(*cur_map);
            MapWrapperSP new_map = MapWrapperSP(new_map_raw);

            // Add a new item.
            item = new_map->addItem(lat_name);
            item->addLatency(lat_value);

            // Atomic CAS, from current map to new map
            MapWrapperSP expected = cur_map;
            if (latestMap.compare_exchange(expected, new_map)) {
                // Succeeded.
                return;
            }

            // Failed, other thread updated the map at the same time.
            // Delete newly added item.
            new_map_raw->delItem(lat_name);
            // Retry.
        } while (ticks_allowed--);

        // Update failed, ignore the given latency at this time.
    }